

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_pack_s16_u8(c_v64 a,c_v64 b)

{
  c_v64 cVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local.u16[3] = a.u16[3];
  if (a_local.s16[3] < 0x100) {
    if (a.s64 < 0) {
      a_local.u16[3] = 0;
    }
    uVar2 = (undefined1)a_local.u16[3];
  }
  else {
    uVar2 = 0xff;
  }
  a_local.u16[2] = a.u16[2];
  if (a_local.s16[2] < 0x100) {
    if (a_local.s16[2] < 0) {
      a_local.u16[2] = 0;
    }
    uVar3 = (undefined1)a_local.u16[2];
  }
  else {
    uVar3 = 0xff;
  }
  a_local.u16[1] = a.u16[1];
  if (a_local.s16[1] < 0x100) {
    if (a_local.s16[1] < 0) {
      a_local.u16[1] = 0;
    }
    uVar4 = (undefined1)a_local.u16[1];
  }
  else {
    uVar4 = 0xff;
  }
  a_local.u16[0] = a.u16[0];
  if (a_local.s16[0] < 0x100) {
    if (a_local.s16[0] < 0) {
      a_local.u16[0] = 0;
    }
    uVar5 = (undefined1)a_local.u16[0];
  }
  else {
    uVar5 = 0xff;
  }
  b_local.u16[3] = b.u16[3];
  if (b_local.s16[3] < 0x100) {
    if (b.s64 < 0) {
      b_local.u16[3] = 0;
    }
    uVar6 = (undefined1)b_local.u16[3];
  }
  else {
    uVar6 = 0xff;
  }
  b_local.u16[2] = b.u16[2];
  if (b_local.s16[2] < 0x100) {
    if (b_local.s16[2] < 0) {
      b_local.u16[2] = 0;
    }
    uVar7 = (undefined1)b_local.u16[2];
  }
  else {
    uVar7 = 0xff;
  }
  b_local.u16[1] = b.u16[1];
  if (b_local.s16[1] < 0x100) {
    if (b_local.s16[1] < 0) {
      b_local.u16[1] = 0;
    }
    uVar8 = (undefined1)b_local.u16[1];
  }
  else {
    uVar8 = 0xff;
  }
  b_local.u16[0] = b.u16[0];
  if (b_local.s16[0] < 0x100) {
    if (b_local.s16[0] < 0) {
      b_local.u16[0] = 0;
    }
    uVar9 = (undefined1)b_local.u16[0];
  }
  else {
    uVar9 = 0xff;
  }
  cVar1.u8[1] = uVar8;
  cVar1.u8[0] = uVar9;
  cVar1.u8[2] = uVar7;
  cVar1.u8[3] = uVar6;
  cVar1.u8[4] = uVar5;
  cVar1.u8[5] = uVar4;
  cVar1.u8[6] = uVar3;
  cVar1.u8[7] = uVar2;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s16_u8(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.u8[7] = SIMD_CLAMP(a.s16[3], 0, 255);
  t.u8[6] = SIMD_CLAMP(a.s16[2], 0, 255);
  t.u8[5] = SIMD_CLAMP(a.s16[1], 0, 255);
  t.u8[4] = SIMD_CLAMP(a.s16[0], 0, 255);
  t.u8[3] = SIMD_CLAMP(b.s16[3], 0, 255);
  t.u8[2] = SIMD_CLAMP(b.s16[2], 0, 255);
  t.u8[1] = SIMD_CLAMP(b.s16[1], 0, 255);
  t.u8[0] = SIMD_CLAMP(b.s16[0], 0, 255);
  return t;
}